

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  string *psVar1;
  string *extraout_RDX;
  string language;
  string fproj;
  cmGeneratedFileStream fout;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)&fproj,(string *)psVar1);
  std::__cxx11::string::append((char *)&fproj);
  std::__cxx11::string::append((string *)&fproj);
  std::__cxx11::string::append((char *)&fproj);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&fproj,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  cmGlobalGhsMultiGenerator::WriteFileHeader
            ((cmGlobalGhsMultiGenerator *)
             (this->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,(ostream *)&fout);
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)&fout);
  if (this->TagType != CUSTOM_TARGET) {
    psVar1 = &this->ConfigName;
    cmGeneratorTarget::GetLinkerLanguage(&language,this->GeneratorTarget,psVar1);
    WriteTargetSpecifics(this,(ostream *)&fout,psVar1);
    SetCompilerFlags(this,psVar1,&language);
    WriteCompilerFlags(this,(ostream *)&fout,extraout_RDX,&language);
    WriteCompilerDefinitions(this,(ostream *)&fout,psVar1,&language);
    WriteIncludes(this,(ostream *)&fout,psVar1,&language);
    WriteTargetLinkLine(this,(ostream *)&fout,psVar1);
    WriteBuildEvents(this,(ostream *)&fout);
    std::__cxx11::string::~string((string *)&language);
  }
  WriteSources(this,(ostream *)&fout);
  cmGeneratedFileStream::Close(&fout);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&fproj);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj = this->LocalGenerator->GetCurrentBinaryDirectory();
  fproj += "/";
  fproj += this->Name;
  fproj += cmGlobalGhsMultiGenerator::FILE_EXTENSION;
  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}